

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

uint TryLowerConstantToMemory(RegVmLoweredBlock *lowBlock,VmValue *value)

{
  RegVmLoweredModule *this;
  double dVar1;
  longlong lVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  VmConstant *pVVar6;
  uint local_70;
  uint local_6c;
  uint elementValue;
  uint i;
  uint index_6;
  uint index_4;
  uint uStack_58;
  uint index_5;
  uint data_1 [2];
  uint index_2;
  uint uStack_44;
  uint index_3;
  uint data [2];
  uint index;
  uint index_1;
  RegVmLoweredModule *lowModule;
  VmConstant *constant;
  VmValue *value_local;
  RegVmLoweredBlock *lowBlock_local;
  
  pVVar6 = getType<VmConstant>(value);
  if (pVVar6 != (VmConstant *)0x0) {
    this = lowBlock->parent->parent;
    bVar4 = VmType::operator==(&(pVVar6->super_VmValue).type,&VmType::Int);
    if (bVar4) {
      if (((pVVar6->super_VmValue).type.type == VM_TYPE_POINTER) && (pVVar6->iValue != 0)) {
        __assert_fail("constant->iValue == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x1f9,"unsigned int TryLowerConstantToMemory(RegVmLoweredBlock *, VmValue *)"
                     );
      }
      uVar5 = RegVmLoweredModule::FindConstant(this,pVVar6->iValue);
      if (uVar5 != 0) {
        return uVar5;
      }
      uVar5 = SmallArray<unsigned_int,_256U>::size(&this->constants);
      data[1] = uVar5 + 1;
      data[0] = pVVar6->iValue;
      SmallArray<unsigned_int,_256U>::push_back(&this->constants,data);
      return data[1];
    }
    bVar4 = VmType::operator==(&(pVVar6->super_VmValue).type,&VmType::Double);
    if (bVar4) {
      dVar1 = pVVar6->dValue;
      uStack_44 = SUB84(dVar1,0);
      index_3 = (uint)((ulong)dVar1 >> 0x20);
      uVar5 = index_3;
      uVar3 = uStack_44;
      _uStack_44 = dVar1;
      uVar5 = RegVmLoweredModule::FindConstant(this,uVar3,uVar5);
      if (uVar5 != 0) {
        return uVar5;
      }
      uVar5 = SmallArray<unsigned_int,_256U>::size(&this->constants);
      if ((uVar5 & 1) != 0) {
        data_1[1] = 0;
        SmallArray<unsigned_int,_256U>::push_back(&this->constants,data_1 + 1);
      }
      uVar5 = SmallArray<unsigned_int,_256U>::size(&this->constants);
      data_1[0] = uVar5 + 1;
      SmallArray<unsigned_int,_256U>::push_back(&this->constants,&stack0xffffffffffffffbc);
      SmallArray<unsigned_int,_256U>::push_back(&this->constants,&index_3);
      return data_1[0];
    }
    bVar4 = VmType::operator==(&(pVVar6->super_VmValue).type,&VmType::Long);
    if ((bVar4) ||
       (((pVVar6->super_VmValue).type.type == VM_TYPE_POINTER &&
        (pVVar6->container == (VariableData *)0x0)))) {
      if (((pVVar6->super_VmValue).type.type == VM_TYPE_POINTER) && (pVVar6->iValue != 0)) {
        __assert_fail("constant->iValue == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x219,"unsigned int TryLowerConstantToMemory(RegVmLoweredBlock *, VmValue *)"
                     );
      }
      lVar2 = pVVar6->lValue;
      uStack_58 = (uint)lVar2;
      index_5 = (uint)((ulong)lVar2 >> 0x20);
      uVar5 = index_5;
      uVar3 = uStack_58;
      _uStack_58 = lVar2;
      index_4 = RegVmLoweredModule::FindConstant(this,uVar3,uVar5);
      if (index_4 != 0) {
        return index_4;
      }
      uVar5 = SmallArray<unsigned_int,_256U>::size(&this->constants);
      if ((uVar5 & 1) != 0) {
        index_6 = 0;
        SmallArray<unsigned_int,_256U>::push_back(&this->constants,&index_6);
      }
      uVar5 = SmallArray<unsigned_int,_256U>::size(&this->constants);
      i = uVar5 + 1;
      SmallArray<unsigned_int,_256U>::push_back(&this->constants,&stack0xffffffffffffffa8);
      SmallArray<unsigned_int,_256U>::push_back(&this->constants,&index_5);
      return i;
    }
    if ((pVVar6->super_VmValue).type.type == VM_TYPE_STRUCT) {
      uVar5 = SmallArray<unsigned_int,_256U>::size(&this->constants);
      elementValue = uVar5 + 1;
      if (((pVVar6->super_VmValue).type.size & 3) == 0) {
        for (local_6c = 0; local_6c < (pVVar6->super_VmValue).type.size >> 2;
            local_6c = local_6c + 1) {
          local_70 = *(uint *)(pVVar6->sValue + (local_6c << 2));
          SmallArray<unsigned_int,_256U>::push_back(&this->constants,&local_70);
        }
        return elementValue;
      }
      __assert_fail("constant->type.size % 4 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x22f,"unsigned int TryLowerConstantToMemory(RegVmLoweredBlock *, VmValue *)");
    }
  }
  return 0;
}

Assistant:

unsigned TryLowerConstantToMemory(RegVmLoweredBlock *lowBlock, VmValue *value)
{
	if(VmConstant *constant = getType<VmConstant>(value))
	{
		RegVmLoweredModule *lowModule = lowBlock->parent->parent;

		if(constant->type == VmType::Int || (constant->type.type == VM_TYPE_POINTER && NULLC_PTR_SIZE == 4 && !constant->container))
		{
			if(constant->type.type == VM_TYPE_POINTER)
				assert(constant->iValue == 0);

			if(unsigned index = lowModule->FindConstant(constant->iValue))
				return index;

			unsigned index = lowModule->constants.size() + 1;

			lowModule->constants.push_back(constant->iValue);

			return index;
		}
		else if(constant->type == VmType::Double)
		{
			unsigned data[2];
			memcpy(data, &constant->dValue, 8);

			if(unsigned index = lowModule->FindConstant(data[0], data[1]))
				return index;

			if(lowModule->constants.size() % 2 != 0)
				lowModule->constants.push_back(0);

			unsigned index = lowModule->constants.size() + 1;

			lowModule->constants.push_back(data[0]);
			lowModule->constants.push_back(data[1]);

			return index;
		}
		else if(constant->type == VmType::Long || (constant->type.type == VM_TYPE_POINTER && NULLC_PTR_SIZE == 8 && !constant->container))
		{
			if(constant->type.type == VM_TYPE_POINTER)
				assert(constant->iValue == 0);

			unsigned data[2];
			memcpy(data, &constant->lValue, 8);

			if(unsigned index = lowModule->FindConstant(data[0], data[1]))
				return index;

			if(lowModule->constants.size() % 2 != 0)
				lowModule->constants.push_back(0);

			unsigned index = lowModule->constants.size() + 1;

			lowModule->constants.push_back(data[0]);
			lowModule->constants.push_back(data[1]);

			return index;
		}
		else if(constant->type.type == VM_TYPE_STRUCT)
		{
			unsigned index = lowModule->constants.size() + 1;

			assert(constant->type.size % 4 == 0);

			for(unsigned i = 0; i < constant->type.size / 4; i++)
			{
				unsigned elementValue;
				memcpy(&elementValue, constant->sValue + i * 4, 4);
				lowModule->constants.push_back(elementValue);
			}

			return index;
		}
	}

	return 0;
}